

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O2

BinsSelectExpr *
slang::ast::ConditionBinsSelectExpr::fromSyntax
          (BinsSelectConditionExprSyntax *syntax,ASTContext *context)

{
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *pSVar1;
  RangeListSyntax *pRVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  Symbol *args;
  ConditionBinsSelectExpr *pCVar6;
  Type *lvalueType;
  ExpressionSyntax *syntax_00;
  BinsSelectExpr *pBVar7;
  undefined4 extraout_var_00;
  iterator *src;
  iterator *extraout_RDX;
  size_t extraout_RDX_00;
  Compilation *compilation;
  SourceRange sourceRange;
  iterator __begin3;
  Expression *local_78;
  SmallVector<const_slang::ast::Expression_*,_5UL> buffer;
  
  compilation = ((context->scope).ptr)->compilation;
  iVar5 = Expression::bind((int)(syntax->name).ptr,(sockaddr *)context,0x4000000);
  bVar4 = Expression::bad((Expression *)CONCAT44(extraout_var,iVar5));
  if (!bVar4) {
    args = Expression::getSymbolReference((Expression *)CONCAT44(extraout_var,iVar5),true);
    if ((args != (Symbol *)0x0) &&
       ((args->kind == Coverpoint ||
        ((args->kind == CoverageBin && (args->parentScope->thisSym->kind == Coverpoint)))))) {
      pCVar6 = BumpAllocator::emplace<slang::ast::ConditionBinsSelectExpr,slang::ast::Symbol_const&>
                         (&compilation->super_BumpAllocator,args);
      if (syntax->intersects != (IntersectClauseSyntax *)0x0) {
        if (args->kind != Coverpoint) {
          args = args->parentScope->thisSym;
        }
        lvalueType = DeclaredType::getType((DeclaredType *)&args[1].originatingSyntax);
        buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
             (pointer)buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
        buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
        buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
        pRVar2 = (syntax->intersects->ranges).ptr;
        pSVar1 = &pRVar2->valueRanges;
        src = &__begin3;
        __begin3.index = 0;
        sVar3 = (pRVar2->valueRanges).elements._M_extent._M_extent_value;
        __begin3.list = pSVar1;
        for (; (__begin3.list != pSVar1 || (__begin3.index != sVar3 + 1 >> 1));
            __begin3.index = __begin3.index + 1) {
          syntax_00 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
                      iterator_base<slang::syntax::ExpressionSyntax_*>::dereference(&__begin3);
          local_78 = bindCovergroupExpr(syntax_00,context,lvalueType,
                                        (bitmask<slang::ast::ASTFlags>)0x0);
          SmallVectorBase<slang::ast::Expression_const*>::
          emplace_back<slang::ast::Expression_const*>
                    ((SmallVectorBase<slang::ast::Expression_const*> *)&buffer,&local_78);
          src = extraout_RDX;
        }
        iVar5 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                          (&buffer.super_SmallVectorBase<const_slang::ast::Expression_*>,
                           (EVP_PKEY_CTX *)compilation,(EVP_PKEY_CTX *)src);
        (pCVar6->intersects)._M_ptr = (pointer)CONCAT44(extraout_var_00,iVar5);
        (pCVar6->intersects)._M_extent._M_extent_value = extraout_RDX_00;
        SmallVectorBase<const_slang::ast::Expression_*>::cleanup
                  (&buffer.super_SmallVectorBase<const_slang::ast::Expression_*>,
                   (EVP_PKEY_CTX *)compilation);
      }
      return &pCVar6->super_BinsSelectExpr;
    }
    sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)(syntax->name).ptr);
    ASTContext::addDiag(context,(DiagCode)0x620007,sourceRange);
  }
  pBVar7 = BinsSelectExpr::badExpr(compilation,(BinsSelectExpr *)0x0);
  return pBVar7;
}

Assistant:

BinsSelectExpr& ConditionBinsSelectExpr::fromSyntax(const BinsSelectConditionExprSyntax& syntax,
                                                    const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& nameExpr = Expression::bind(*syntax.name, context, ASTFlags::AllowCoverpoint);
    if (nameExpr.bad())
        return badExpr(comp, nullptr);

    auto sym = nameExpr.getSymbolReference();
    if (!sym || (sym->kind != SymbolKind::Coverpoint &&
                 (sym->kind != SymbolKind::CoverageBin ||
                  sym->getParentScope()->asSymbol().kind != SymbolKind::Coverpoint))) {
        context.addDiag(diag::InvalidBinsTarget, syntax.name->sourceRange());
        return badExpr(comp, nullptr);
    }

    auto expr = comp.emplace<ConditionBinsSelectExpr>(*sym);

    if (syntax.intersects) {
        const Type* type;
        if (sym->kind == SymbolKind::Coverpoint)
            type = &sym->as<CoverpointSymbol>().declaredType.getType();
        else
            type = &sym->getParentScope()->asSymbol().as<CoverpointSymbol>().declaredType.getType();

        SmallVector<const Expression*> buffer;
        for (auto elem : syntax.intersects->ranges->valueRanges)
            buffer.push_back(&bindCovergroupExpr(*elem, context, type));
        expr->intersects = buffer.copy(comp);
    }

    return *expr;
}